

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_Jinx::Guid_&,_const_Jinx::Guid_&> * __thiscall
Catch::ExprLhs<Jinx::Guid_const&>::operator==
          (BinaryExpr<const_Jinx::Guid_&,_const_Jinx::Guid_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Guid_const&> *this,Guid *rhs)

{
  Guid *lhs;
  bool comparisonResult;
  StringRef local_30;
  Guid *local_20;
  Guid *rhs_local;
  ExprLhs<const_Jinx::Guid_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (Guid *)this;
  this_local = (ExprLhs<const_Jinx::Guid_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<Jinx::Guid,Jinx::Guid>(*(Guid **)this,rhs);
  lhs = *(Guid **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_Jinx::Guid_&,_const_Jinx::Guid_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }